

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelExporter.cpp
# Opt level: O2

int __thiscall iDynTree::ModelExporter::init(ModelExporter *this,EVP_PKEY_CTX *ctx)

{
  SensorsList *this_00;
  undefined4 uVar1;
  ModelExporterOptions *in_RCX;
  SensorsList *in_RDX;
  Model modelCopy;
  ModelExporterOptions local_1b0;
  Model local_150 [304];
  
  iDynTree::Model::Model(local_150,(Model *)ctx);
  this_00 = (SensorsList *)iDynTree::Model::sensors();
  iDynTree::SensorsList::operator=(this_00,in_RDX);
  ModelExporterOptions::ModelExporterOptions(&local_1b0,in_RCX);
  init(this,(EVP_PKEY_CTX *)local_150);
  ModelExporterOptions::~ModelExporterOptions(&local_1b0);
  uVar1 = iDynTree::Model::~Model(local_150);
  return CONCAT31((int3)((uint)uVar1 >> 8),1);
}

Assistant:

bool ModelExporter::init(const Model& model,
                         const SensorsList& sensors,
                         const ModelExporterOptions options)
{
    Model modelCopy = model;
    modelCopy.sensors() = sensors;
    return init(modelCopy, options);
}